

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::mark_undo_ref(CVmObjDict *this,CVmUndoRecord *undo_rec)

{
  long in_RSI;
  dict_undo_rec *rec;
  uint in_stack_ffffffffffffffd8;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (((*(long *)(in_RSI + 8) != 0) && (1 < **(uint **)(in_RSI + 8))) &&
     (**(uint **)(in_RSI + 8) == 2)) {
    CVmObjTable::mark_all_refs
              ((CVmObjTable *)CONCAT44(2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void CVmObjDict::mark_undo_ref(VMG_ CVmUndoRecord *undo_rec)
{
    /* check our private record if we have one */
    if (undo_rec->id.ptrval != 0)
    {
        dict_undo_rec *rec;

        /* get my undo record */
        rec = (dict_undo_rec *)undo_rec->id.ptrval;

        /* take the appropriate action */
        switch(rec->action)
        {
        case DICT_UNDO_COMPARATOR:
            /* the 'obj' entry is the old comparator object */
            G_obj_table->mark_all_refs(rec->obj, VMOBJ_REACHABLE);
            break;

        case DICT_UNDO_ADD:
        case DICT_UNDO_DEL:
            /* 
             *   these actions use only weak references, so there's nothing
             *   to do here 
             */
            break;
        }
    }
}